

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modkey.c
# Opt level: O0

int ffmkyl(fitsfile *fptr,char *keyname,int value,char *comm,int *status)

{
  int iVar1;
  int *in_RCX;
  undefined4 in_EDX;
  char *in_RSI;
  char *in_RDI;
  int *in_R8;
  char card [81];
  char oldcomm [73];
  char valstring [71];
  char *in_stack_fffffffffffffed8;
  int in_stack_fffffffffffffee0;
  int *in_stack_ffffffffffffff28;
  char *in_stack_ffffffffffffff30;
  char *in_stack_ffffffffffffff38;
  char *in_stack_ffffffffffffff40;
  fitsfile *in_stack_ffffffffffffff48;
  int *in_stack_ffffffffffffff50;
  char *in_stack_ffffffffffffff58;
  fitsfile *in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  if (*in_R8 < 1) {
    iVar1 = ffgkey(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
                   in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    if (iVar1 < 1) {
      ffl2c(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,(int *)0x20dc12);
      if ((in_RCX == (int *)0x0) || ((char)*in_RCX == '&')) {
        ffmkky((char *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,in_RSI,
               (char *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),in_RCX);
      }
      else {
        ffmkky((char *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,in_RSI,
               (char *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),in_RCX);
      }
      ffmkey(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
      iVar1 = *in_R8;
    }
    else {
      iVar1 = *in_R8;
    }
  }
  else {
    iVar1 = *in_R8;
  }
  return iVar1;
}

Assistant:

int ffmkyl(fitsfile *fptr,          /* I - FITS file pointer  */
           const char *keyname,     /* I - keyword name       */
           int value,               /* I - keyword value      */
           const char *comm,        /* I - keyword comment    */
           int *status)             /* IO - error status      */
{
    char valstring[FLEN_VALUE];
    char oldcomm[FLEN_COMMENT];
    char card[FLEN_CARD];

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    if (ffgkey(fptr, keyname, valstring, oldcomm, status) > 0)
        return(*status);                               /* get old comment */

    ffl2c(value, valstring, status);   /* convert value to a string */

    if (!comm || comm[0] == '&')  /* preserve the current comment string */
        ffmkky(keyname, valstring, oldcomm, card, status);
    else
        ffmkky(keyname, valstring, comm, card, status);

    ffmkey(fptr, card, status);

    return(*status);
}